

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbuttongroup.cpp
# Opt level: O1

int __thiscall QButtonGroup::checkedId(QButtonGroup *this)

{
  long lVar1;
  int iVar2;
  Node<QAbstractButton_*,_int> *pNVar3;
  int *piVar4;
  long in_FS_OFFSET;
  QAbstractButton *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&this->field_0x8;
  if ((*(long *)(lVar1 + 0x90) == 0) || (*(int *)(*(long *)(lVar1 + 0x90) + 4) == 0)) {
    local_10 = (QAbstractButton *)0x0;
  }
  else {
    local_10 = *(QAbstractButton **)(lVar1 + 0x98);
  }
  if (*(Data<QHashPrivate::Node<QAbstractButton*,int>> **)(lVar1 + 0xa8) !=
      (Data<QHashPrivate::Node<QAbstractButton*,int>> *)0x0) {
    pNVar3 = QHashPrivate::Data<QHashPrivate::Node<QAbstractButton*,int>>::
             findNode<QAbstractButton*>
                       (*(Data<QHashPrivate::Node<QAbstractButton*,int>> **)(lVar1 + 0xa8),&local_10
                       );
    if (pNVar3 != (Node<QAbstractButton_*,_int> *)0x0) {
      piVar4 = &pNVar3->value;
      goto LAB_003ca6ba;
    }
  }
  piVar4 = (int *)0x0;
LAB_003ca6ba:
  if (piVar4 == (int *)0x0) {
    iVar2 = -1;
  }
  else {
    iVar2 = *piVar4;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return iVar2;
  }
  __stack_chk_fail();
}

Assistant:

int QButtonGroup::checkedId() const
{
    Q_D(const QButtonGroup);
    return d->mapping.value(d->checkedButton, -1);
}